

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O1

int codebook_decode_scalar_raw(vorb *f,Codebook *c)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint32 *puVar4;
  uint8 *puVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  
  if (f->valid_bits < 0x19) {
    if (f->valid_bits == 0) {
      f->acc = 0;
    }
    do {
      if (((f->last_seg != 0) && (f->bytes_in_seg == '\0')) ||
         (iVar6 = get8_packet_raw(f), iVar6 == -1)) break;
      iVar2 = f->valid_bits;
      f->acc = f->acc + (iVar6 << ((byte)iVar2 & 0x1f));
      f->valid_bits = iVar2 + 8;
    } while (iVar2 < 0x11);
  }
  puVar4 = c->codewords;
  if ((puVar4 == (uint32 *)0x0) && (c->sorted_codewords == (uint32 *)0x0)) {
    return -1;
  }
  iVar6 = c->entries;
  if ((long)iVar6 < 9) {
    if (puVar4 == (uint32 *)0x0) goto LAB_001454d1;
LAB_00145588:
    if (c->sparse != '\0') {
      __assert_fail("!c->sparse",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_vorbis.h"
                    ,0x691,"int codebook_decode_scalar_raw(vorb *, Codebook *)");
    }
    if (0 < iVar6) {
      puVar5 = c->codeword_lengths;
      uVar9 = 0;
      do {
        bVar1 = puVar5[uVar9];
        if ((bVar1 != 0xff) && (puVar4[uVar9] == (~(-1 << (bVar1 & 0x1f)) & f->acc))) {
          if (f->valid_bits < (int)(uint)bVar1) goto LAB_001455d3;
          f->acc = f->acc >> (bVar1 & 0x1f);
          iVar6 = f->valid_bits - (uint)puVar5[uVar9];
          goto LAB_001455da;
        }
        uVar9 = uVar9 + 1;
      } while ((long)iVar6 != uVar9);
    }
    f->error = VORBIS_invalid_stream;
  }
  else {
    if (c->sorted_codewords == (uint32 *)0x0) goto LAB_00145588;
LAB_001454d1:
    uVar3 = f->acc;
    uVar10 = c->sorted_entries;
    uVar9 = 0;
    if (1 < (int)uVar10) {
      uVar7 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      uVar7 = (uVar7 & 0xf0f0f0f) << 4 | uVar7 >> 4 & 0xf0f0f0f;
      uVar7 = (uVar7 >> 2 & 0x33333333) + (uVar7 & 0x33333333) * 4;
      uVar8 = 0;
      do {
        uVar11 = uVar10 >> 1;
        uVar9 = (ulong)(uVar11 + uVar8);
        if ((uVar7 >> 1 & 0x55555555) + (uVar7 & 0x55555555) * 2 < c->sorted_codewords[uVar9]) {
          uVar9 = (ulong)uVar8;
          uVar10 = uVar11;
        }
        else {
          uVar10 = uVar10 - uVar11;
        }
        uVar8 = (uint)uVar9;
      } while (1 < (int)uVar10);
    }
    if (c->sparse == '\0') {
      uVar9 = (ulong)(uint)c->sorted_values[uVar9];
    }
    bVar1 = c->codeword_lengths[(int)uVar9];
    iVar6 = f->valid_bits - (uint)bVar1;
    if ((int)(uint)bVar1 <= f->valid_bits) {
      f->acc = uVar3 >> (bVar1 & 0x1f);
      goto LAB_001455da;
    }
  }
LAB_001455d3:
  uVar9 = 0xffffffff;
  iVar6 = 0;
LAB_001455da:
  f->valid_bits = iVar6;
  return (int)uVar9;
}

Assistant:

static int codebook_decode_scalar_raw(vorb *f, Codebook *c)
{
   int i;
   prep_huffman(f);

   if (c->codewords == NULL && c->sorted_codewords == NULL)
      return -1;

   // cases to use binary search: sorted_codewords && !c->codewords
   //                             sorted_codewords && c->entries > 8
   if (c->entries > 8 ? c->sorted_codewords!=NULL : !c->codewords) {
      // binary search
      uint32 code = bit_reverse(f->acc);
      int x=0, n=c->sorted_entries, len;

      while (n > 1) {
         // invariant: sc[x] <= code < sc[x+n]
         int m = x + (n >> 1);
         if (c->sorted_codewords[m] <= code) {
            x = m;
            n -= (n>>1);
         } else {
            n >>= 1;
         }
      }
      // x is now the sorted index
      if (!c->sparse) x = c->sorted_values[x];
      // x is now sorted index if sparse, or symbol otherwise
      len = c->codeword_lengths[x];
      if (f->valid_bits >= len) {
         f->acc >>= len;
         f->valid_bits -= len;
         return x;
      }

      f->valid_bits = 0;
      return -1;
   }

   // if small, linear search
   assert(!c->sparse);
   for (i=0; i < c->entries; ++i) {
      if (c->codeword_lengths[i] == NO_CODE) continue;
      if (c->codewords[i] == (f->acc & ((1 << c->codeword_lengths[i])-1))) {
         if (f->valid_bits >= c->codeword_lengths[i]) {
            f->acc >>= c->codeword_lengths[i];
            f->valid_bits -= c->codeword_lengths[i];
            return i;
         }
         f->valid_bits = 0;
         return -1;
      }
   }

   error(f, VORBIS_invalid_stream);
   f->valid_bits = 0;
   return -1;
}